

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,SignNode *signNode)

{
  int iVar1;
  uint uVar2;
  ExpNode *pEVar3;
  char *__format;
  
  pEVar3 = signNode->exp;
  if (pEVar3 == (ExpNode *)0x0) {
    uVar2 = (signNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    __format = "[SEMANTIC ERROR - signNode] INVALID EXPRESSION, line %d\n";
    goto LAB_0010fa96;
  }
  (*(pEVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar3,this);
  pEVar3 = signNode->exp;
  iVar1 = pEVar3->type;
  if (iVar1 == 0xb) {
    if (pEVar3->arraySize < 0) {
LAB_0010fa50:
      if (pEVar3->pointer != true) {
        (signNode->super_ExpNode).type = iVar1;
        (signNode->super_ExpNode).typeLexeme = pEVar3->typeLexeme;
        (signNode->super_ExpNode).arraySize = -1;
        (signNode->super_ExpNode).lValue = false;
        (signNode->super_ExpNode).pointer = false;
        return;
      }
    }
  }
  else if ((pEVar3->arraySize < 0) && (iVar1 == 0xc)) goto LAB_0010fa50;
  uVar2 = (signNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
  __format = "[SEMANTIC ERROR - signNode] CANNOT NEGATIVE A NON NUMERIC VALUE, line %d\n";
LAB_0010fa96:
  fprintf(_stderr,__format,(ulong)uVar2);
  return;
}

Assistant:

void SemanticTypes::visit(SignNode *signNode) {
    if (signNode->getExp()) {
        signNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] INVALID EXPRESSION, line %d\n", signNode->getLine());
        return;
    }

    bool isArray = signNode->getExp()->getArraySize() > -1;
    if ((signNode->getExp()->getType() != INT && signNode->getExp()->getType() != FLOAT) || isArray ||
        signNode->getExp()->isPointer()) {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] CANNOT NEGATIVE A NON NUMERIC VALUE, line %d\n",
                signNode->getLine());
        return;
    }

    signNode->setType(signNode->getExp()->getType());
    signNode->setTypeLexeme(signNode->getExp()->getTypeLexeme());
    signNode->setPointer(false);
    signNode->setArraySize(-1);
    signNode->setLValue(false);
}